

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<unsigned_int,_8UL>::insert
          (SmallVector<unsigned_int,_8UL> *this,uint *itr,uint *insert_begin,uint *insert_end)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *local_88;
  uint *local_70;
  uint *source_itr_1;
  uint *target_itr_1;
  uint *source_itr;
  uint *original_source_itr;
  uint *target_itr;
  uint *new_buffer;
  size_t target_capacity;
  size_t i;
  size_t count;
  uint *insert_end_local;
  uint *insert_begin_local;
  uint *itr_local;
  SmallVector<unsigned_int,_8UL> *this_local;
  
  puVar1 = (uint *)((long)insert_end - (long)insert_begin >> 2);
  puVar2 = VectorView<unsigned_int>::end(&this->super_VectorView<unsigned_int>);
  if (itr == puVar2) {
    reserve(this,(this->super_VectorView<unsigned_int>).buffer_size + (long)puVar1);
    insert_end_local = insert_begin;
    for (target_capacity = 0; target_capacity < puVar1; target_capacity = target_capacity + 1) {
      (this->super_VectorView<unsigned_int>).ptr
      [(this->super_VectorView<unsigned_int>).buffer_size + target_capacity] = *insert_end_local;
      insert_end_local = insert_end_local + 1;
    }
    (this->super_VectorView<unsigned_int>).buffer_size =
         (long)puVar1 + (this->super_VectorView<unsigned_int>).buffer_size;
  }
  else {
    if (this->buffer_capacity < (this->super_VectorView<unsigned_int>).buffer_size + (long)puVar1) {
      new_buffer = (uint *)((this->super_VectorView<unsigned_int>).buffer_size + (long)puVar1);
      if (new_buffer == (uint *)0x0) {
        new_buffer = (uint *)0x1;
      }
      if (new_buffer < (uint *)0x8) {
        new_buffer = (uint *)0x8;
      }
      for (; new_buffer < puVar1; new_buffer = (uint *)((long)new_buffer << 1)) {
      }
      if (new_buffer < (uint *)0x9) {
        local_88 = AlignedBuffer<unsigned_int,_8UL>::data(&this->stack_storage);
      }
      else {
        local_88 = (uint *)malloc((long)new_buffer << 2);
      }
      if (local_88 == (uint *)0x0) {
        ::std::terminate();
      }
      original_source_itr = local_88;
      source_itr = VectorView<unsigned_int>::begin(&this->super_VectorView<unsigned_int>);
      target_itr_1 = insert_begin;
      if (local_88 != (this->super_VectorView<unsigned_int>).ptr) {
        for (; source_itr != itr; source_itr = source_itr + 1) {
          *original_source_itr = *source_itr;
          original_source_itr = original_source_itr + 1;
        }
      }
      for (; target_itr_1 != insert_end; target_itr_1 = target_itr_1 + 1) {
        *original_source_itr = *target_itr_1;
        original_source_itr = original_source_itr + 1;
      }
      if ((local_88 != (this->super_VectorView<unsigned_int>).ptr) || (insert_begin != insert_end))
      {
        for (; puVar2 = VectorView<unsigned_int>::end(&this->super_VectorView<unsigned_int>),
            source_itr != puVar2; source_itr = source_itr + 1) {
          *original_source_itr = *source_itr;
          original_source_itr = original_source_itr + 1;
        }
      }
      puVar2 = (this->super_VectorView<unsigned_int>).ptr;
      puVar3 = AlignedBuffer<unsigned_int,_8UL>::data(&this->stack_storage);
      if (puVar2 != puVar3) {
        free((this->super_VectorView<unsigned_int>).ptr);
      }
      (this->super_VectorView<unsigned_int>).ptr = local_88;
      this->buffer_capacity = (size_t)new_buffer;
    }
    else {
      puVar2 = VectorView<unsigned_int>::end(&this->super_VectorView<unsigned_int>);
      source_itr_1 = puVar2 + (long)puVar1;
      local_70 = VectorView<unsigned_int>::end(&this->super_VectorView<unsigned_int>);
      while (puVar2 = VectorView<unsigned_int>::end(&this->super_VectorView<unsigned_int>),
            source_itr_1 != puVar2 && local_70 != itr) {
        source_itr_1 = source_itr_1 + -1;
        local_70 = local_70 + -1;
        *source_itr_1 = *local_70;
      }
      ::std::move_backward<unsigned_int*,unsigned_int*>(itr,local_70,source_itr_1);
      insert_end_local = insert_begin;
      insert_begin_local = itr;
      while (puVar2 = VectorView<unsigned_int>::end(&this->super_VectorView<unsigned_int>),
            insert_begin_local != puVar2 && insert_end_local != insert_end) {
        *insert_begin_local = *insert_end_local;
        insert_end_local = insert_end_local + 1;
        insert_begin_local = insert_begin_local + 1;
      }
      for (; insert_end_local != insert_end; insert_end_local = insert_end_local + 1) {
        *insert_begin_local = *insert_end_local;
        insert_begin_local = insert_begin_local + 1;
      }
    }
    (this->super_VectorView<unsigned_int>).buffer_size =
         (long)puVar1 + (this->super_VectorView<unsigned_int>).buffer_size;
  }
  return;
}

Assistant:

void insert(T *itr, const T *insert_begin, const T *insert_end) SPIRV_CROSS_NOEXCEPT
	{
		auto count = size_t(insert_end - insert_begin);
		if (itr == this->end())
		{
			reserve(this->buffer_size + count);
			for (size_t i = 0; i < count; i++, insert_begin++)
				new (&this->ptr[this->buffer_size + i]) T(*insert_begin);
			this->buffer_size += count;
		}
		else
		{
			if (this->buffer_size + count > buffer_capacity)
			{
				auto target_capacity = this->buffer_size + count;
				if (target_capacity == 0)
					target_capacity = 1;
				if (target_capacity < N)
					target_capacity = N;

				while (target_capacity < count)
					target_capacity <<= 1u;

				// Need to allocate new buffer. Move everything to a new buffer.
				T *new_buffer =
				    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

				// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
				if (!new_buffer)
					std::terminate();

				// First, move elements from source buffer to new buffer.
				// We don't deal with types which can throw in move constructor.
				auto *target_itr = new_buffer;
				auto *original_source_itr = this->begin();

				if (new_buffer != this->ptr)
				{
					while (original_source_itr != itr)
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				// Copy-construct new elements.
				for (auto *source_itr = insert_begin; source_itr != insert_end; ++source_itr, ++target_itr)
					new (target_itr) T(*source_itr);

				// Move over the other half.
				if (new_buffer != this->ptr || insert_begin != insert_end)
				{
					while (original_source_itr != this->end())
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				if (this->ptr != stack_storage.data())
					free(this->ptr);
				this->ptr = new_buffer;
				buffer_capacity = target_capacity;
			}
			else
			{
				// Move in place, need to be a bit careful about which elements are constructed and which are not.
				// Move the end and construct the new elements.
				auto *target_itr = this->end() + count;
				auto *source_itr = this->end();
				while (target_itr != this->end() && source_itr != itr)
				{
					--target_itr;
					--source_itr;
					new (target_itr) T(std::move(*source_itr));
				}

				// For already constructed elements we can move-assign.
				std::move_backward(itr, source_itr, target_itr);

				// For the inserts which go to already constructed elements, we can do a plain copy.
				while (itr != this->end() && insert_begin != insert_end)
					*itr++ = *insert_begin++;

				// For inserts into newly allocated memory, we must copy-construct instead.
				while (insert_begin != insert_end)
				{
					new (itr) T(*insert_begin);
					++itr;
					++insert_begin;
				}
			}

			this->buffer_size += count;
		}
	}